

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse2_128_32.c
# Opt level: O0

parasail_result_t *
parasail_sw_table_striped_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i *palVar4;
  __m128i *palVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  __m128i *b;
  uint uVar9;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  __m128i *palVar11;
  int32_t in_R9D;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  uint uVar12;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i alVar13;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i c;
  __m128i vH_00;
  __m128i vH_01;
  int32_t in_stack_fffffffffffffc08;
  int32_t temp;
  int32_t column_len;
  int32_t *t;
  __m128i *pv_2;
  __m128i *pv_1;
  __m128i vCompare;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  parasail_result_t *result;
  longlong lStack_368;
  int32_t maxp;
  __m128i vMaxHUnit;
  __m128i vMaxH;
  int32_t local_33c;
  int32_t score;
  __m128i vNegInf;
  __m128i vZero;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvE;
  __m128i *pvHMax;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_2b8;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  size_t len;
  longlong extraout_RDX_01;
  ulong uVar10;
  longlong extraout_RDX_02;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse2_128_32","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile32).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse2_128_32",
            "profile->profile32.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse2_128_32",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_striped_profile_sse2_128_32",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse2_128_32","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_striped_profile_sse2_128_32","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_striped_profile_sse2_128_32","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_striped_profile_sse2_128_32","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    local_2b8 = 0;
    iVar8 = profile->s1Len;
    iVar6 = (iVar8 + 3) / 4;
    lStack_368 = -0x3fffffff40000000;
    vMaxHUnit[0] = -0x3fffffff40000000;
    local_33c = -0x40000000;
    iVar7 = profile->matrix->max;
    profile_local = (parasail_profile_t *)parasail_result_new_table1(iVar6 * 4,s2Len);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x4400804;
      uVar9 = *(uint *)&profile_local->field_0xc | 0x20000;
      len = (size_t)uVar9;
      *(uint *)&profile_local->field_0xc = uVar9;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar6);
      pvHMax = parasail_memalign___m128i(0x10,(long)iVar6);
      pvE = parasail_memalign___m128i(0x10,(long)iVar6);
      b = parasail_memalign___m128i(0x10,(long)iVar6);
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMax == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar13[0] = (long)iVar6;
        alVar13[1] = extraout_RDX;
        parasail_memset___m128i(pvHLoad,alVar13,len);
        c[0] = (long)iVar6;
        c[1] = extraout_RDX_00;
        palVar11 = b;
        parasail_memset___m128i(b,c,len);
        vMaxHUnit[1] = lStack_368;
        vMaxH[0] = vMaxHUnit[0];
        for (end_query = 0; palVar5 = pvHLoad, palVar4 = pvE, end_query < s2Len;
            end_query = end_query + 1) {
          vH[1] = 0;
          vF[0] = 0;
          vH_01[0] = (ulong)end_query;
          uVar10 = (ulong)(byte)s2[vH_01[0]];
          if (local_2b8 == end_query + -2) {
            pvE = pvHMax;
            pvHLoad = palVar4;
          }
          else {
            pvHLoad = pvHMax;
          }
          pvHMax = palVar5;
          for (k = 0; k < iVar6; k = k + 1) {
            b_00[1] = (long)k * 0x10;
            a[1] = vH_01[0];
            a[0] = (longlong)palVar11;
            b_00[0] = uVar10;
            alVar13 = _mm_max_epi32_rpl(a,b_00);
            b_01[0] = alVar13[1];
            a_00[1] = vH_01[0];
            a_00[0] = (longlong)palVar11;
            b_01[1] = b_00[1];
            alVar13 = _mm_max_epi32_rpl(a_00,b_01);
            b_02[0] = alVar13[1];
            a_01[1] = vH_01[0];
            a_01[0] = (longlong)palVar11;
            b_02[1] = b_00[1];
            _mm_max_epi32_rpl(a_01,b_02);
            pvHLoad[k][0] = extraout_XMM0_Qa;
            pvHLoad[k][1] = extraout_XMM0_Qb;
            palVar11 = (__m128i *)
                       ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                       rowcols->score_row;
            vH_00[0] = (ulong)(uint)k;
            vH_01[0] = (ulong)(uint)end_query;
            vH_00[1]._0_4_ = iVar6;
            vH_00[1]._4_4_ = 0;
            arr_store_si128((int *)palVar11,vH_00,end_query,s2Len,in_R9D,in_stack_fffffffffffffc08);
            a_02[1] = vH_00[0];
            a_02[0] = (longlong)palVar11;
            b_03[1] = vH_01[0];
            b_03[0] = extraout_RDX_01;
            alVar13 = _mm_max_epi32_rpl(a_02,b_03);
            b_04[0] = alVar13[1];
            a_03[1] = vH_00[0];
            a_03[0] = (longlong)palVar11;
            b_04[1] = vH_01[0];
            alVar13 = _mm_max_epi32_rpl(a_03,b_04);
            b_05[0] = alVar13[1];
            b_05[1] = (long)k * 0x10;
            b[k][0] = extraout_XMM0_Qa_01;
            b[k][1] = extraout_XMM0_Qb_01;
            a_04[1] = vH_00[0];
            a_04[0] = (longlong)palVar11;
            alVar13 = _mm_max_epi32_rpl(a_04,b_05);
            uVar10 = alVar13[1];
            vH_01[0] = vH_00[0];
            vH[1] = extraout_XMM0_Qa_02;
            vF[0] = extraout_XMM0_Qb_02;
            vMaxHUnit[1] = extraout_XMM0_Qa_00;
            vMaxH[0] = extraout_XMM0_Qb_00;
          }
          for (end_ref = 0; end_ref < 4; end_ref = end_ref + 1) {
            vF[0] = vF[0] << 0x20 | (ulong)vH[1] >> 0x20;
            vH[1] = vH[1] << 0x20;
            for (k = 0; k < iVar6; k = k + 1) {
              b_06[1] = (long)k * 0x10;
              a_05[1] = vH_01[0];
              a_05[0] = (longlong)palVar11;
              b_06[0] = uVar10;
              _mm_max_epi32_rpl(a_05,b_06);
              pvHLoad[k][0] = extraout_XMM0_Qa_03;
              pvHLoad[k][1] = extraout_XMM0_Qb_03;
              palVar11 = (__m128i *)
                         ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                         rowcols->score_row;
              vH_01[0] = (ulong)(uint)k;
              uVar10 = (ulong)(uint)end_query;
              vH_01[1]._0_4_ = iVar6;
              vH_01[1]._4_4_ = 0;
              arr_store_si128((int *)palVar11,vH_01,end_query,s2Len,in_R9D,in_stack_fffffffffffffc08
                             );
              a_06[1] = vH_01[0];
              a_06[0] = (longlong)palVar11;
              b_07[1] = uVar10;
              b_07[0] = extraout_RDX_02;
              alVar13 = _mm_max_epi32_rpl(a_06,b_07);
              uVar10 = alVar13[1];
              local_178 = (int)extraout_XMM0_Qa_03;
              iStack_174 = (int)((ulong)extraout_XMM0_Qa_03 >> 0x20);
              iStack_170 = (int)extraout_XMM0_Qb_03;
              iStack_16c = (int)((ulong)extraout_XMM0_Qb_03 >> 0x20);
              local_198 = (int)vH[1];
              iStack_194 = (int)((ulong)vH[1] >> 0x20);
              iStack_190 = (int)vF[0];
              iStack_18c = (int)((ulong)vF[0] >> 0x20);
              iStack_18c = iStack_18c - gap;
              vH[1] = CONCAT44(iStack_194 - gap,local_198 - gap);
              vF[0] = CONCAT44(iStack_18c,iStack_190 - gap);
              bVar1 = iStack_16c - open < iStack_18c;
              uVar9 = -(uint)bVar1;
              auVar3._4_4_ = -(uint)(iStack_174 - open < iStack_194 - gap);
              auVar3._0_4_ = -(uint)(local_178 - open < local_198 - gap);
              auVar3._8_4_ = -(uint)(iStack_170 - open < iStack_190 - gap);
              auVar3._12_4_ = uVar9;
              vMaxHUnit[1] = extraout_XMM0_Qa_04;
              vMaxH[0] = extraout_XMM0_Qb_04;
              if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar3 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar3 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar3 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar3 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar3 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar3 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar3 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar3 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar3 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar3 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar3 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (uVar9 >> 7 & 1) == 0) && (uVar9 >> 0xf & 1) == 0) && (uVar9 >> 0x17 & 1) == 0)
                  && !bVar1) goto LAB_006b90e4;
            }
          }
LAB_006b90e4:
          local_d8 = (int)vMaxHUnit[1];
          iStack_d4 = (int)((ulong)vMaxHUnit[1] >> 0x20);
          iStack_d0 = (int)vMaxH[0];
          iStack_cc = (int)((ulong)vMaxH[0] >> 0x20);
          local_e8 = (int)lStack_368;
          iStack_e4 = (int)((ulong)lStack_368 >> 0x20);
          iStack_e0 = (int)vMaxHUnit[0];
          iStack_dc = (int)((ulong)vMaxHUnit[0] >> 0x20);
          uVar9 = -(uint)(iStack_e0 < iStack_d0);
          uVar12 = -(uint)(iStack_dc < iStack_cc);
          auVar2._4_4_ = -(uint)(iStack_e4 < iStack_d4);
          auVar2._0_4_ = -(uint)(local_e8 < local_d8);
          auVar2._12_4_ = uVar12;
          auVar2._8_4_ = uVar9;
          if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar9 & 0x80) != 0) || (uVar9 & 0x8000) != 0) || (uVar9 & 0x800000) != 0) ||
                 uVar9 != 0) || (uVar12 >> 7 & 1) != 0) || (uVar12 >> 0xf & 1) != 0) ||
              (uVar12 >> 0x17 & 1) != 0) || iStack_dc < iStack_cc) {
            a_07[1] = vH_01[0];
            a_07[0] = (longlong)palVar11;
            local_33c = _mm_hmax_epi32_rpl(a_07);
            if (0x7fffffff - (iVar7 + 1) < local_33c) {
              *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
              break;
            }
            lStack_368 = CONCAT44(local_33c,local_33c);
            vMaxHUnit[0] = CONCAT44(local_33c,local_33c);
            local_2b8 = end_query;
          }
        }
        palVar11 = pvE;
        if (local_33c == 0x7fffffff) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
        }
        iVar7 = parasail_result_is_saturated((parasail_result_t *)profile_local);
        if (iVar7 == 0) {
          if (local_2b8 == end_query + -1) {
            pvE = pvHLoad;
            pvHLoad = palVar11;
          }
          else if (local_2b8 == end_query + -2) {
            pvE = pvHMax;
            pvHMax = palVar11;
          }
          _temp = pvE;
          s1Len = iVar8 + -1;
          for (k = 0; k < iVar6 * 4; k = k + 1) {
            if (((int)(*_temp)[0] == local_33c) && (iVar8 = k / 4 + (k % 4) * iVar6, iVar8 < s1Len))
            {
              s1Len = iVar8;
            }
            _temp = (__m128i *)((long)*_temp + 4);
          }
        }
        else {
          local_33c = 0x7fffffff;
          s1Len = 0;
          local_2b8 = 0;
        }
        *(int32_t *)&profile_local->s1 = local_33c;
        *(int32_t *)((long)&profile_local->s1 + 4) = s1Len;
        profile_local->s1Len = local_2b8;
        parasail_free(b);
        parasail_free(pvE);
        parasail_free(pvHMax);
        parasail_free(pvHLoad);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vNegInf;
    int32_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int32_t maxp = 0;
    /*int32_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    vZero = _mm_setzero_si128();
    vNegInf = _mm_set1_epi32(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT32_MAX : (int32_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi32(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32_rpl(vH, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            vH = _mm_max_epi32_rpl(vH, vZero);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 4);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT32_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}